

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uras.c
# Opt level: O1

void insert_node(qnode_ptr_t p,qnode_ptr_t *h,qnode_ptr_t *q)

{
  t_qnode *ptVar1;
  t_qnode **pptVar2;
  qnode_ptr_t ptVar3;
  t_qnode **pptVar4;
  bool bVar5;
  
  ptVar1 = *h;
  bVar5 = ptVar1 == (qnode_ptr_t)0x0;
  if ((bVar5) || (ptVar1->level <= p->level)) {
    ptVar3 = (qnode_ptr_t)0x0;
  }
  else {
    do {
      ptVar3 = ptVar1;
      ptVar1 = ptVar3->forth;
      bVar5 = ptVar1 == (t_qnode *)0x0;
      if (bVar5) break;
    } while (p->level < ptVar1->level);
  }
  pptVar4 = &ptVar3->forth;
  if (ptVar3 == (qnode_ptr_t)0x0) {
    pptVar4 = h;
  }
  pptVar2 = &ptVar1->back;
  if (bVar5) {
    pptVar2 = q;
  }
  *pptVar4 = p;
  *pptVar2 = p;
  p->back = ptVar3;
  p->forth = ptVar1;
  return;
}

Assistant:

void insert_node(p,h,q)
qnode_ptr_t p, *h, *q ;

{ qnode_ptr_t s, t ;

  t = *h ;
  s = (qnode_ptr_t)NULL ;
  while ((t != (qnode_ptr_t)NULL) && (p->level < t->level)) {
    s = t ;
    t = t->forth ;
  }
  if (s != (qnode_ptr_t)NULL) {
    s->forth = p ;
  }
  else {
    *h = p ;
  }
  if (t != (qnode_ptr_t)NULL) {
    t->back = p ;
  }
  else {
    *q = p ;
  }
  p->back = s ;
  p->forth = t ;
}